

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableOffsetCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestNode *pTVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  deInt32 *pdVar5;
  SharedPtr unsized;
  string local_50;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,context->m_testCtx,"sized","Sized target");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar2[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,(TestCaseGroup *)pTVar2,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_OFFSET,TYPE_FLOAT,&local_50,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar4 = parentStructure->m_state;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
  unsized.m_state = (SharedPtrStateBase *)0x0;
  unsized.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  unsized.m_state = pSVar4;
  pTVar2 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,context->m_testCtx,"unsized","Unsized target");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar2[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
  generateBufferBackedVariableAggregateTypeCases
            (context,&unsized,(TestCaseGroup *)pTVar2,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_OFFSET,TYPE_FLOAT,&local_50,2);
  pdVar5 = &pSVar4->strongRefCount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    unsized.m_ptr = (Node *)0x0;
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(unsized.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if ((*pdVar5 == 0) && (unsized.m_state != (SharedPtrStateBase *)0x0)) {
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableOffsetCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// .sized
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_OFFSET, glu::TYPE_FLOAT, "", 3);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, unsized, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_OFFSET, glu::TYPE_FLOAT, "", 2);
	}
}